

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O3

void __thiscall
IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test::TestBody
          (IsorecursiveTest_CanonicalizeTypesBeforeSubtyping_Test *this)

{
  Nullability NVar1;
  char *in_R9;
  initializer_list<wasm::Field> __l;
  initializer_list<wasm::Field> __l_00;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  AssertHelper local_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  string local_68;
  _Variadic_union<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  local_48;
  byte local_30;
  TypeBuilder local_20;
  TypeBuilder builder;
  
  wasm::TypeBuilder::TypeBuilder(&local_20,6);
  wasm::TypeBuilder::createRecGroup((ulong)&local_20,0);
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)0x0);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)0x1);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_20);
  wasm::TypeBuilder::setSubType((ulong)&local_20,(HeapType)0x1);
  wasm::TypeBuilder::createRecGroup((ulong)&local_20,2);
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)0x2);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  local_48._0_8_ = (void *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)0x3);
  if ((void *)local_48._0_8_ != (void *)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_20);
  wasm::TypeBuilder::setSubType((ulong)&local_20,(HeapType)0x3);
  NVar1 = wasm::TypeBuilder::getTempHeapType((ulong)&local_20);
  local_88 = (undefined1  [8])wasm::TypeBuilder::getTempRefType((HeapType)&local_20,NVar1);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_88;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&local_68,__l,
             (allocator_type *)&local_70);
  local_48._0_8_ = local_68._M_dataplus._M_p;
  local_48._8_8_ = local_68._M_string_length;
  local_48._16_8_ = local_68.field_2._M_allocated_capacity;
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)0x4);
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  NVar1 = wasm::TypeBuilder::getTempHeapType((ulong)&local_20);
  local_88 = (undefined1  [8])wasm::TypeBuilder::getTempRefType((HeapType)&local_20,NVar1);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_88;
  std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
            ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&local_68,__l_00,
             (allocator_type *)&local_70);
  local_48._0_8_ = local_68._M_dataplus._M_p;
  local_48._8_8_ = local_68._M_string_length;
  local_48._16_8_ = local_68.field_2._M_allocated_capacity;
  local_68._M_dataplus._M_p = (char *)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  wasm::TypeBuilder::setHeapType((ulong)&local_20,(Struct *)&DAT_00000005);
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_,local_48._16_8_ - local_48._0_8_);
  }
  if (local_68._M_dataplus._M_p != (char *)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  wasm::TypeBuilder::getTempHeapType((ulong)&local_20);
  wasm::TypeBuilder::setSubType((ulong)&local_20,(HeapType)0x5);
  wasm::TypeBuilder::build();
  local_88[0] = local_30 == 0;
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_30 != 0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_68,(internal *)local_88,(AssertionResult *)"result","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x1fe,local_68._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_78,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_70._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_70._M_head_impl + 8))();
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
  }
  (*std::__detail::__variant::
    __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
    ::_S_vtable._M_arr[local_30]._M_data)
            ((anon_class_1_0_00000001 *)&local_68,
             (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
              *)&local_48._M_first);
  wasm::TypeBuilder::~TypeBuilder(&local_20);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeTypesBeforeSubtyping) {
  TypeBuilder builder(6);
  // A rec group
  builder.createRecGroup(0, 2);
  builder[0] = Struct{};
  builder[1] = Struct{};
  builder[1].subTypeOf(builder[0]);

  // The same rec group again
  builder.createRecGroup(2, 2);
  builder[2] = Struct{};
  builder[3] = Struct{};
  builder[3].subTypeOf(builder[2]);

  // This subtyping only validates if the previous two groups are deduplicated
  // before checking subtype validity.
  builder[4] =
    Struct({Field(builder.getTempRefType(builder[0], Nullable), Immutable)});
  builder[5] =
    Struct({Field(builder.getTempRefType(builder[3], Nullable), Immutable)});
  builder[5].subTypeOf(builder[4]);

  auto result = builder.build();
  EXPECT_TRUE(result);
}